

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::OneHotEncoder::_InternalSerialize
          (OneHotEncoder *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  OneHotEncoder_HandleUnknown OVar2;
  int size;
  StringVector *value;
  Int64Vector *value_00;
  uint8_t *puVar3;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  OneHotEncoder *this_local;
  
  bVar1 = _internal_has_stringcategories(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = _Internal::stringcategories(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::StringVector>(1,value,puVar3,stream);
  }
  bVar1 = _internal_has_int64categories(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::int64categories(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::Int64Vector>
                             (2,value_00,puVar3,stream);
  }
  bVar1 = _internal_outputsparse(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_outputsparse(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray(10,bVar1,puVar3);
  }
  OVar2 = _internal_handleunknown(this);
  if (OVar2 != OneHotEncoder_HandleUnknown_ErrorOnUnknown) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    OVar2 = _internal_handleunknown(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xb,OVar2,puVar3);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* OneHotEncoder::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.OneHotEncoder)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringVector stringCategories = 1;
  if (_internal_has_stringcategories()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::stringcategories(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64Categories = 2;
  if (_internal_has_int64categories()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::int64categories(this), target, stream);
  }

  // bool outputSparse = 10;
  if (this->_internal_outputsparse() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(10, this->_internal_outputsparse(), target);
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->_internal_handleunknown() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      11, this->_internal_handleunknown(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.OneHotEncoder)
  return target;
}